

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EpsRefine.h
# Opt level: O1

istream * covenant::operator>>(istream *in,GeneralizationMethod *gen)

{
  int iVar1;
  string *psVar2;
  GeneralizationMethod GVar3;
  string token;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  local_60 = 0;
  local_58[0] = 0;
  local_68 = local_58;
  std::operator>>(in,(string *)&local_68);
  iVar1 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar1 == 0) {
    GVar3 = GREEDY;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_68);
    GVar3 = MAX_GEN;
    if (iVar1 != 0) {
      psVar2 = (string *)__cxa_allocate_exception(0x20);
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Invalid generalization method","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_48,local_48 + local_40);
      __cxa_throw(psVar2,&error::typeinfo,error::~error);
    }
  }
  *gen = GVar3;
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return in;
}

Assistant:

std::istream& operator>>(std::istream& in, GeneralizationMethod& gen)
{
    std::string token;
    in >> token;
    if (token == "greedy")
        gen = GREEDY;
    else if (token == "max-gen")
        gen = MAX_GEN;
    else 
      throw error("Invalid generalization method");
    return in;
}